

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderInvariance.cpp
# Opt level: O3

bool __thiscall
glcts::TessellationShaderInvarianceRule4Test::isVertexDefined
          (TessellationShaderInvarianceRule4Test *this,float *vertex_data,uint n_vertices,
          float *vertex_data_seeked,uint n_vertex_data_seeked_components)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  bool bVar4;
  
  if (n_vertices == 0) {
    bVar4 = false;
  }
  else {
    bVar4 = true;
    uVar1 = 1;
    uVar2 = 0;
    do {
      uVar3 = uVar2 & 0xffffffff;
      if ((*vertex_data_seeked == vertex_data[uVar3]) &&
         (!NAN(*vertex_data_seeked) && !NAN(vertex_data[uVar3]))) {
        if ((vertex_data_seeked[1] == vertex_data[uVar3 + 1]) &&
           (!NAN(vertex_data_seeked[1]) && !NAN(vertex_data[uVar3 + 1]))) {
          if (n_vertex_data_seeked_components < 3) {
            return bVar4;
          }
          if ((vertex_data_seeked[2] == vertex_data[uVar3 + 2]) &&
             (!NAN(vertex_data_seeked[2]) && !NAN(vertex_data[uVar3 + 2]))) {
            return bVar4;
          }
        }
      }
      bVar4 = uVar1 < n_vertices;
      uVar2 = uVar2 + 3;
      uVar1 = uVar1 + 1;
    } while ((ulong)n_vertices * 3 != uVar2);
  }
  return bVar4;
}

Assistant:

bool TessellationShaderInvarianceRule4Test::isVertexDefined(const float* vertex_data, unsigned int n_vertices,
															const float* vertex_data_seeked,
															unsigned int n_vertex_data_seeked_components)
{
	bool result = false;

	DE_ASSERT(n_vertex_data_seeked_components >= 2);

	for (unsigned int n_vertex = 0; n_vertex < n_vertices; ++n_vertex)
	{
		const float* current_vertex_data = vertex_data + 3 /* components */ * n_vertex;

		if ((vertex_data_seeked[0] == current_vertex_data[0]) && (vertex_data_seeked[1] == current_vertex_data[1]) &&
			((n_vertex_data_seeked_components < 3) ||
			 (n_vertex_data_seeked_components >= 3 && (vertex_data_seeked[2] == current_vertex_data[2]))))
		{
			result = true;

			break;
		} /* if (components match) */
	}	 /* for (all vertices) */

	return result;
}